

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cipher.cc
# Opt level: O0

int SSL_CIPHER_get_digest_nid(SSL_CIPHER *cipher)

{
  uint32_t uVar1;
  SSL_CIPHER *cipher_local;
  
  uVar1 = cipher->algorithm_mac;
  if (uVar1 == 1) {
    cipher_local._4_4_ = 0x40;
  }
  else if (uVar1 == 2) {
    cipher_local._4_4_ = 0x2a0;
  }
  else {
    if (uVar1 != 4) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cipher.cc"
                    ,0x52a,"int SSL_CIPHER_get_digest_nid(const SSL_CIPHER *)");
    }
    cipher_local._4_4_ = 0;
  }
  return cipher_local._4_4_;
}

Assistant:

int SSL_CIPHER_get_digest_nid(const SSL_CIPHER *cipher) {
  switch (cipher->algorithm_mac) {
    case SSL_AEAD:
      return NID_undef;
    case SSL_SHA1:
      return NID_sha1;
    case SSL_SHA256:
      return NID_sha256;
  }
  assert(0);
  return NID_undef;
}